

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

void __thiscall soul::heart::Parser::scanNextTopLevelItem(Parser *this,ScannedTopLevelItem *item)

{
  pool_ptr<soul::Module> *this_00;
  bool bVar1;
  Module *pMVar2;
  CompileMessage local_50;
  
  this_00 = &this->module;
  pMVar2 = pool_ptr<soul::Module>::operator->(this_00);
  if (pMVar2->moduleType == graphModule) {
LAB_002730de:
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
            ::matchIf<char_const*>
                      ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                        *)this,"input");
    if (bVar1) {
      scanInput(this,item);
      return;
    }
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
            ::matchIf<char_const*>
                      ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                        *)this,"output");
    if (bVar1) {
      scanOutput(this,item);
      return;
    }
  }
  else {
    pMVar2 = pool_ptr<soul::Module>::operator->(this_00);
    if (pMVar2->moduleType == processorModule) goto LAB_002730de;
  }
  pMVar2 = pool_ptr<soul::Module>::operator->(this_00);
  if (pMVar2->moduleType == graphModule) {
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
            ::matchIf<char_const*>
                      ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                        *)this,"node");
    if (bVar1) {
      parseNode(this);
      return;
    }
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
            ::matchIf<char_const*>
                      ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                        *)this,"connection");
    if (bVar1) {
      parseConnection(this);
      return;
    }
  }
  else {
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
            ::matchIf<char_const*>
                      ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                        *)this,"struct");
    if (bVar1) {
      scanStruct(this,item);
      return;
    }
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
            ::matchIf<char_const*>
                      ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                        *)this,"function");
    if (bVar1) {
      bVar1 = false;
LAB_002731c7:
      scanFunction(this,item,bVar1);
      return;
    }
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
            ::matchIf<char_const*>
                      ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                        *)this,"var");
    if (bVar1) {
      bVar1 = false;
      goto LAB_0027321f;
    }
    pMVar2 = pool_ptr<soul::Module>::operator->(this_00);
    if (pMVar2->moduleType == processorModule) {
      bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
              ::matchIf<char_const*>
                        ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                          *)this,"event");
      if (bVar1) {
        bVar1 = true;
        goto LAB_002731c7;
      }
      bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
              ::matchIf<char_const*>
                        ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                          *)this,"processor");
      if (bVar1) {
        parseLatency(this);
        return;
      }
    }
  }
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
          ::matchIf<char_const*>
                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      *)this,"let");
  if (!bVar1) {
    Errors::expectedTopLevelDecl<>();
    (*(this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser[2])(this,&local_50);
    CompileMessage::~CompileMessage(&local_50);
    return;
  }
  bVar1 = true;
LAB_0027321f:
  scanStateVariable(this,item,bVar1);
  return;
}

Assistant:

void scanNextTopLevelItem (ScannedTopLevelItem& item)
    {
        if (module->isGraph() || module->isProcessor())
        {
            if (matchIf ("input"))       return scanInput (item);
            if (matchIf ("output"))      return scanOutput (item);
        }

        if (module->isGraph())
        {
            if (matchIf ("node"))        return parseNode();
            if (matchIf ("connection"))  return parseConnection();
        }
        else
        {
            if (matchIf ("struct"))      return scanStruct (item);
            if (matchIf ("function"))    return scanFunction (item, false);
            if (matchIf ("var"))         return scanStateVariable (item, false);

            if (module->isProcessor())
            {
                if (matchIf ("event"))       return scanFunction (item, true);
                if (matchIf ("processor"))   return parseLatency();
            }
        }

        if (matchIf ("let"))
            return scanStateVariable (item, true);

        throwError (Errors::expectedTopLevelDecl());
    }